

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O2

sunrealtype cvQuadSensNorm(CVodeMem cv_mem,N_Vector *xQS,N_Vector *wQS)

{
  double dVar1;
  long lVar2;
  sunrealtype sVar3;
  
  N_VWrmsNormVectorArray(cv_mem->cv_Ns,xQS,wQS,cv_mem->cv_cvals);
  sVar3 = *cv_mem->cv_cvals;
  for (lVar2 = 1; lVar2 < cv_mem->cv_Ns; lVar2 = lVar2 + 1) {
    dVar1 = cv_mem->cv_cvals[lVar2];
    if (dVar1 <= sVar3) {
      dVar1 = sVar3;
    }
    sVar3 = dVar1;
  }
  return sVar3;
}

Assistant:

static sunrealtype cvQuadSensNorm(CVodeMem cv_mem, N_Vector* xQS, N_Vector* wQS)
{
  int is;
  sunrealtype nrm;

  (void)N_VWrmsNormVectorArray(cv_mem->cv_Ns, xQS, wQS, cv_mem->cv_cvals);

  nrm = cv_mem->cv_cvals[0];
  for (is = 1; is < cv_mem->cv_Ns; is++)
  {
    if (cv_mem->cv_cvals[is] > nrm) { nrm = cv_mem->cv_cvals[is]; }
  }

  return (nrm);
}